

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager_stateless_kernel_1.h
# Opt level: O0

void __thiscall
dlib::
memory_manager_stateless_kernel_1<dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::node>
::deallocate(memory_manager_stateless_kernel_1<dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::node>
             *this,node *item)

{
  void *in_RSI;
  node *unaff_retaddr;
  
  if (in_RSI != (void *)0x0) {
    queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::node::
    ~node(unaff_retaddr);
    operator_delete(in_RSI);
  }
  return;
}

Assistant:

void deallocate (
                T* item
            )
            {
                delete item;
            }